

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O2

void __thiscall
absl::lts_20240722::strings_internal::
SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::SplitIterator(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *this,State state,
               Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
               *splitter)

{
  char *pcVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> bStack_30;
  
  this->pos_ = 0;
  this->state_ = state;
  (this->curr_)._M_len = 0;
  (this->curr_)._M_str = (char *)0x0;
  this->splitter_ = splitter;
  (this->delimiter_).c_ = (splitter->delimiter_).c_;
  sVar2 = (splitter->text_)._M_len;
  if ((splitter->text_)._M_str == (char *)0x0) {
    this->state_ = kEndState;
  }
  else if (state != kEndState) {
    if (this->state_ == kLastState) {
      this->state_ = kEndState;
    }
    else {
      sVar2 = (this->splitter_->text_)._M_len;
      pcVar1 = (this->splitter_->text_)._M_str;
      bStack_30._M_len = sVar2;
      bStack_30._M_str = pcVar1;
      auVar3 = absl::lts_20240722::ByChar::Find(&this->delimiter_,sVar2,pcVar1,this->pos_);
      if (auVar3._8_8_ == pcVar1 + sVar2) {
        this->state_ = kLastState;
      }
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&bStack_30,this->pos_,(long)auVar3._8_8_ - (long)(pcVar1 + this->pos_));
      (this->curr_)._M_len = bVar4._M_len;
      (this->curr_)._M_str = bVar4._M_str;
      this->pos_ = this->pos_ + auVar3._0_8_ + bVar4._M_len;
    }
    return;
  }
  this->pos_ = sVar2;
  return;
}

Assistant:

SplitIterator(State state, const Splitter* splitter)
      : pos_(0),
        state_(state),
        splitter_(splitter),
        delimiter_(splitter->delimiter()),
        predicate_(splitter->predicate()) {
    // Hack to maintain backward compatibility. This one block makes it so an
    // empty absl::string_view whose .data() happens to be nullptr behaves
    // *differently* from an otherwise empty absl::string_view whose .data() is
    // not nullptr. This is an undesirable difference in general, but this
    // behavior is maintained to avoid breaking existing code that happens to
    // depend on this old behavior/bug. Perhaps it will be fixed one day. The
    // difference in behavior is as follows:
    //   Split(absl::string_view(""), '-');  // {""}
    //   Split(absl::string_view(), '-');    // {}
    if (splitter_->text().data() == nullptr) {
      state_ = kEndState;
      pos_ = splitter_->text().size();
      return;
    }

    if (state_ == kEndState) {
      pos_ = splitter_->text().size();
    } else {
      ++(*this);
    }
  }